

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_format.hpp
# Opt level: O2

void __thiscall csv::CSVFormat::CSVFormat(CSVFormat *this)

{
  initializer_list<char> __l;
  allocator_type local_a;
  char local_9;
  
  local_9 = ',';
  __l._M_len = 1;
  __l._M_array = &local_9;
  std::vector<char,_std::allocator<char>_>::vector(&this->possible_delimiters,__l,&local_a);
  *(undefined8 *)
   ((long)&(this->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(this->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  (this->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  this->quote_char = '\"';
  (this->col_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->col_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->col_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->col_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

CSVFormat() = default;